

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::PrepareObjects
          (RenderbufferAttachmentErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 *puVar8;
  uint uVar9;
  GLint max_color_attachments;
  undefined8 uStack_28;
  long lVar7;
  
  uStack_28 = in_RAX;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x6d0))(1,&this->m_fbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x12f9);
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x12fc);
  (**(code **)(lVar7 + 0x6e8))(1,&this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x12ff);
  (**(code **)(lVar7 + 0xa0))(0x8d41,this->m_rbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1302);
  do {
    pcVar1 = *(code **)(lVar7 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  do {
    pcVar1 = *(code **)(lVar7 + 0xca8);
    this->m_rbo_invalid = this->m_rbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  uStack_28._4_4_ = 8;
  (**(code **)(lVar7 + 0x868))(0x8cdf,(long)&uStack_28 + 4);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x130d);
  this->m_color_attachment_invalid = uStack_28._4_4_ + 0x8ce0;
  uVar9 = this->m_attachment_invalid;
  while( true ) {
    if (((uVar9 == 0x8219) || (uVar9 == 0x8d1f)) || (uVar9 == 0x8cff)) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    uVar9 = uVar9 + 1;
    if (0x8ce0 < uVar9) break;
    if (!bVar2) {
      this->m_attachment_invalid = uVar9;
      this->m_renderbuffer_target_invalid = 0x8d42;
      return;
    }
  }
  uVar6 = this->m_attachment_invalid + 1;
  uVar9 = 0x8ce1;
  if (0x8ce1 < uVar6) {
    uVar9 = uVar6;
  }
  this->m_attachment_invalid = uVar9;
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

void RenderbufferAttachmentErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genRenderbuffers(1, &m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
	while (gl.isRenderbuffer(++m_rbo_invalid))
		;

	/* Max color attachments query. */
	glw::GLint max_color_attachments = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	/* Invalid color attachment */
	m_color_attachment_invalid = GL_COLOR_ATTACHMENT0 + max_color_attachments;

	/* Invalid attachment. */
	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		if ((GL_DEPTH_ATTACHMENT == m_attachment_invalid) || (GL_STENCIL_ATTACHMENT == m_attachment_invalid) ||
			(GL_DEPTH_STENCIL_ATTACHMENT == m_attachment_invalid))
		{
			is_attachment = true;
		}

		if (GL_COLOR_ATTACHMENT0 < m_attachment_invalid)
		{
			/* If this unlikely happen this mean that we cannot create invalid attachment which is not DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT and
			 GL_COLOR_ATTACHMENTm where m IS any positive integer number (for m < MAX_COLOR_ATTACHMENTS attachments are valid, and for m >= MAX_COLOR_ATTACHMENTS is invalid, but
			 INVALID_OPERATION shall be generated instead of INVALID_ENUM. Such a situation may need change in the test or in the specification. */
			throw 0;
		}
	}

	/* Invalid renderbuffer target. */
	m_renderbuffer_target_invalid = GL_RENDERBUFFER + 1;
}